

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O3

int __thiscall
ncnn::Gemm::forward(Gemm *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  size_t sVar2;
  int *piVar3;
  pointer pMVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  size_t sVar29;
  size_t sVar30;
  size_t *psVar31;
  void *pvVar32;
  ulong uVar33;
  uint uVar34;
  int iVar35;
  float *pfVar36;
  ulong uVar37;
  uint uVar38;
  uint uVar39;
  int iVar40;
  long lVar41;
  uint uVar42;
  long lVar43;
  undefined4 *puVar44;
  ulong uVar45;
  Mat *pMVar46;
  float *pfVar47;
  Mat *pMVar48;
  bool bVar49;
  bool bVar50;
  float fVar51;
  uint local_194;
  ulong local_190;
  Mat local_188;
  ulong local_138;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_130;
  int local_124;
  int local_120;
  int local_11c;
  Mat local_118;
  Mat local_c8;
  long local_80;
  float *local_78;
  int *local_70;
  long local_68;
  void *local_60;
  void *local_58;
  size_t *local_50;
  void *local_48;
  ulong local_40;
  long local_38;
  
  if (this->constantA == 0) {
    pMVar46 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (this->constantB != 0) goto LAB_004a19f1;
    pMVar48 = pMVar46 + 1;
  }
  else {
    pMVar46 = &this->A_data;
    if (this->constantB == 0) {
      pMVar48 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    else {
LAB_004a19f1:
      pMVar48 = &this->B_data;
    }
  }
  sVar2 = pMVar46->elemsize;
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  local_130 = top_blobs;
  if (this->transA == 0) {
    if (&local_c8 != pMVar46) {
      piVar3 = pMVar46->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      local_c8.data = pMVar46->data;
      local_c8.refcount._0_4_ = SUB84(pMVar46->refcount,0);
      local_c8.refcount._4_4_ = (undefined4)((ulong)pMVar46->refcount >> 0x20);
      local_c8.elemsize._0_4_ = (undefined4)pMVar46->elemsize;
      local_c8.elemsize._4_4_ = (undefined4)(pMVar46->elemsize >> 0x20);
      local_c8.elempack = pMVar46->elempack;
      local_c8.allocator = pMVar46->allocator;
      uVar5 = pMVar46->dims;
      uVar6 = pMVar46->w;
      uVar7 = pMVar46->h;
      uVar8 = pMVar46->d;
      local_c8.w = uVar6;
      local_c8.h = uVar7;
      local_c8.d = uVar8;
      local_c8.c = pMVar46->c;
      local_c8.cstep = pMVar46->cstep;
      local_c8.dims = uVar5;
    }
  }
  else {
    Mat::create(&local_c8,(&pMVar46->h)[(ulong)(pMVar46->dims == 3) * 2],pMVar46->w,sVar2,
                opt->workspace_allocator);
    if (pMVar46->dims == 3) {
      iVar40 = (int)pMVar46->cstep;
    }
    else {
      iVar40 = pMVar46->w;
    }
    if (0 < (long)local_c8.h) {
      lVar41 = 0;
      lVar43 = 0;
      pvVar32 = local_c8.data;
      do {
        if (0 < local_c8.w) {
          puVar44 = (undefined4 *)((long)pMVar46->data + lVar41);
          uVar45 = 0;
          do {
            *(undefined4 *)((long)pvVar32 + uVar45 * 4) = *puVar44;
            uVar45 = uVar45 + 1;
            puVar44 = puVar44 + iVar40;
          } while ((uint)local_c8.w != uVar45);
        }
        lVar43 = lVar43 + 1;
        lVar41 = lVar41 + 4;
        pvVar32 = (void *)((long)pvVar32 +
                          (long)local_c8.w *
                          CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
      } while (lVar43 != local_c8.h);
    }
  }
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize._0_4_ = 0;
  local_118.elemsize._4_4_ = 0;
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  if (this->transB == 0) {
    Mat::create(&local_118,(&pMVar48->h)[(ulong)(pMVar48->dims == 3) * 2],pMVar48->w,sVar2,
                opt->workspace_allocator);
    if (pMVar48->dims == 3) {
      iVar40 = (int)pMVar48->cstep;
    }
    else {
      iVar40 = pMVar48->w;
    }
    local_190 = (ulong)local_118.h;
    if (0 < (long)local_190) {
      lVar41 = 0;
      uVar45 = 0;
      pvVar32 = local_118.data;
      do {
        if (0 < local_118.w) {
          puVar44 = (undefined4 *)((long)pMVar48->data + lVar41);
          uVar33 = 0;
          do {
            *(undefined4 *)((long)pvVar32 + uVar33 * 4) = *puVar44;
            uVar33 = uVar33 + 1;
            puVar44 = puVar44 + iVar40;
          } while ((uint)local_118.w != uVar33);
        }
        uVar45 = uVar45 + 1;
        lVar41 = lVar41 + 4;
        pvVar32 = (void *)((long)pvVar32 +
                          (long)local_118.w *
                          CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize));
      } while (uVar45 != local_190);
      local_190 = (ulong)(uint)local_118.h;
    }
  }
  else if (&local_118 == pMVar48) {
    local_190 = 0;
  }
  else {
    piVar3 = pMVar48->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    local_118.data = pMVar48->data;
    local_118.refcount._0_4_ = SUB84(pMVar48->refcount,0);
    local_118.refcount._4_4_ = (undefined4)((ulong)pMVar48->refcount >> 0x20);
    local_118.elemsize._0_4_ = (undefined4)pMVar48->elemsize;
    local_118.elemsize._4_4_ = (undefined4)(pMVar48->elemsize >> 0x20);
    local_118.elempack = pMVar48->elempack;
    local_118.allocator = pMVar48->allocator;
    uVar9 = pMVar48->dims;
    uVar10 = pMVar48->w;
    uVar11 = pMVar48->h;
    uVar12 = pMVar48->d;
    local_190 = (ulong)(uint)pMVar48->h;
    local_118.w = uVar10;
    local_118.h = uVar11;
    local_118.d = uVar12;
    local_118.c = pMVar48->c;
    local_118.cstep = pMVar48->cstep;
    local_118.dims = uVar9;
  }
  iVar40 = local_c8.w;
  if (local_118.dims == 3) {
    local_190 = (ulong)(uint)local_118.c;
  }
  uVar45 = (ulong)(uint)local_c8.w;
  uVar1 = (&local_c8.h)[(ulong)(local_c8.dims == 3) * 2];
  if (this->constantC != 0) {
    pfVar47 = (float *)(this->C_data).data;
    local_194 = this->constant_broadcast_type_C;
    goto LAB_004a2269;
  }
  if (this->constantB == 0 || this->constantA == 0) {
    if (this->constantA == 0) {
      if (this->constantB == 0) {
        pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar4 == 0xd8) {
          local_188.data = pMVar4[2].data;
          piVar3 = pMVar4[2].refcount;
          local_188.refcount._0_4_ = SUB84(piVar3,0);
          local_188.refcount._4_4_ = (undefined4)((ulong)piVar3 >> 0x20);
          local_188.elemsize._0_4_ = (undefined4)pMVar4[2].elemsize;
          local_188.elemsize._4_4_ = (undefined4)(pMVar4[2].elemsize >> 0x20);
          local_188.elempack = pMVar4[2].elempack;
          local_188.allocator = pMVar4[2].allocator;
          uVar25 = pMVar4[2].dims;
          uVar26 = pMVar4[2].w;
          uVar27 = pMVar4[2].h;
          uVar28 = pMVar4[2].d;
          local_188.c = pMVar4[2].c;
          local_188.cstep = pMVar4[2].cstep;
          local_188.dims = uVar25;
          local_188.w = uVar26;
          local_188.h = uVar27;
          local_188.d = uVar28;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
        }
        else {
          local_188.cstep = 0;
          local_188.data = (float *)0x0;
          local_188.refcount._0_4_ = 0;
          local_188.refcount._4_4_ = 0;
          local_188.elemsize._0_4_ = 0;
          local_188.elemsize._4_4_ = 0;
          local_188.elempack = 0;
          local_188.allocator = (Allocator *)0x0;
          local_188.dims = 0;
          local_188.w = 0;
          local_188.h = 0;
          local_188.d = 0;
          local_188.c = 0;
          Mat::create(&local_188,0,4,(Allocator *)0x0);
        }
        pfVar47 = (float *)local_188.data;
        piVar3 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_188.allocator == (Allocator *)0x0) goto LAB_004a21c0;
            (*(local_188.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      else {
        pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar4 == 0x90) {
          local_188.data = pMVar4[1].data;
          piVar3 = pMVar4[1].refcount;
          local_188.refcount._0_4_ = SUB84(piVar3,0);
          local_188.refcount._4_4_ = (undefined4)((ulong)piVar3 >> 0x20);
          local_188.elemsize._0_4_ = (undefined4)pMVar4[1].elemsize;
          local_188.elemsize._4_4_ = (undefined4)(pMVar4[1].elemsize >> 0x20);
          local_188.elempack = pMVar4[1].elempack;
          local_188.allocator = pMVar4[1].allocator;
          uVar21 = pMVar4[1].dims;
          uVar22 = pMVar4[1].w;
          uVar23 = pMVar4[1].h;
          uVar24 = pMVar4[1].d;
          local_188.c = pMVar4[1].c;
          local_188.cstep = pMVar4[1].cstep;
          local_188.dims = uVar21;
          local_188.w = uVar22;
          local_188.h = uVar23;
          local_188.d = uVar24;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
        }
        else {
          local_188.cstep = 0;
          local_188.data = (float *)0x0;
          local_188.refcount._0_4_ = 0;
          local_188.refcount._4_4_ = 0;
          local_188.elemsize._0_4_ = 0;
          local_188.elemsize._4_4_ = 0;
          local_188.elempack = 0;
          local_188.allocator = (Allocator *)0x0;
          local_188.dims = 0;
          local_188.w = 0;
          local_188.h = 0;
          local_188.d = 0;
          local_188.c = 0;
          Mat::create(&local_188,0,4,(Allocator *)0x0);
        }
        pfVar47 = (float *)local_188.data;
        piVar3 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_188.allocator == (Allocator *)0x0) {
LAB_004a21c0:
              pfVar47 = (float *)local_188.data;
              if ((float *)local_188.data != (float *)0x0) {
                free(local_188.data);
              }
            }
            else {
              (*(local_188.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
    else {
      pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pMVar4 == 0x90) {
        local_188.data = pMVar4[1].data;
        piVar3 = pMVar4[1].refcount;
        local_188.refcount._0_4_ = SUB84(piVar3,0);
        local_188.refcount._4_4_ = (undefined4)((ulong)piVar3 >> 0x20);
        local_188.elemsize._0_4_ = (undefined4)pMVar4[1].elemsize;
        local_188.elemsize._4_4_ = (undefined4)(pMVar4[1].elemsize >> 0x20);
        local_188.elempack = pMVar4[1].elempack;
        local_188.allocator = pMVar4[1].allocator;
        uVar13 = pMVar4[1].dims;
        uVar14 = pMVar4[1].w;
        uVar15 = pMVar4[1].h;
        uVar16 = pMVar4[1].d;
        local_188.c = pMVar4[1].c;
        local_188.cstep = pMVar4[1].cstep;
        local_188.dims = uVar13;
        local_188.w = uVar14;
        local_188.h = uVar15;
        local_188.d = uVar16;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
      }
      else {
        local_188.cstep = 0;
        local_188.data = (float *)0x0;
        local_188.refcount._0_4_ = 0;
        local_188.refcount._4_4_ = 0;
        local_188.elemsize._0_4_ = 0;
        local_188.elemsize._4_4_ = 0;
        local_188.elempack = 0;
        local_188.allocator = (Allocator *)0x0;
        local_188.dims = 0;
        local_188.w = 0;
        local_188.h = 0;
        local_188.d = 0;
        local_188.c = 0;
        Mat::create(&local_188,0,4,(Allocator *)0x0);
      }
      pfVar47 = (float *)local_188.data;
      piVar3 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_188.allocator == (Allocator *)0x0) goto LAB_004a21c0;
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar4 == 0x48) {
      local_188.data = pMVar4->data;
      piVar3 = pMVar4->refcount;
      local_188.refcount._0_4_ = SUB84(piVar3,0);
      local_188.refcount._4_4_ = (undefined4)((ulong)piVar3 >> 0x20);
      local_188.elemsize._0_4_ = (undefined4)pMVar4->elemsize;
      local_188.elemsize._4_4_ = (undefined4)(pMVar4->elemsize >> 0x20);
      local_188.elempack = pMVar4->elempack;
      local_188.allocator = pMVar4->allocator;
      uVar17 = pMVar4->dims;
      uVar18 = pMVar4->w;
      uVar19 = pMVar4->h;
      uVar20 = pMVar4->d;
      local_188.c = pMVar4->c;
      local_188.cstep = pMVar4->cstep;
      local_188.dims = uVar17;
      local_188.w = uVar18;
      local_188.h = uVar19;
      local_188.d = uVar20;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
    }
    else {
      local_188.cstep = 0;
      local_188.data = (float *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.allocator = (Allocator *)0x0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      Mat::create(&local_188,0,4,(Allocator *)0x0);
    }
    pfVar47 = (float *)local_188.data;
    piVar3 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_188.allocator == (Allocator *)0x0) goto LAB_004a21c0;
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (pfVar47 == (float *)0x0) {
    pfVar47 = (float *)0x0;
    local_194 = 0;
  }
  else {
    pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    iVar35 = pMVar4[-1].dims;
    uVar34 = pMVar4[-1].w;
    bVar49 = uVar34 == (uint)local_190;
    uVar38 = (uint)(uVar34 == uVar1 && iVar35 == 1);
    uVar42 = uVar38;
    if (bVar49) {
      uVar42 = 4;
    }
    if (iVar35 != 1) {
      uVar42 = uVar38;
    }
    uVar38 = pMVar4[-1].h;
    uVar39 = 2;
    if (uVar38 != uVar1) {
      uVar39 = uVar42;
    }
    if (uVar34 != 1) {
      uVar39 = uVar42;
    }
    bVar50 = iVar35 != 2;
    if (bVar50) {
      uVar39 = uVar42;
    }
    uVar34 = 3;
    if (uVar38 != uVar1) {
      uVar34 = uVar39;
    }
    if (bVar50 || !bVar49) {
      uVar34 = uVar39;
    }
    local_194 = 4;
    if (uVar38 != 1) {
      local_194 = uVar34;
    }
    if (bVar50 || !bVar49) {
      local_194 = uVar34;
    }
  }
LAB_004a2269:
  uVar42 = (uint)local_190;
  uVar34 = uVar1;
  if (this->output_transpose == 0) {
    uVar42 = uVar1;
    uVar34 = (uint)local_190;
  }
  pMVar46 = (local_130->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (this->output_N1M == 0) {
    Mat::create(pMVar46,uVar34,uVar42,sVar2,opt->blob_allocator);
  }
  else {
    Mat::create(pMVar46,uVar34,1,uVar42,sVar2,opt->blob_allocator);
  }
  local_48 = pMVar46->data;
  iVar35 = -100;
  if ((local_48 != (void *)0x0) && ((long)pMVar46->c * pMVar46->cstep != 0)) {
    if (0 < (int)uVar1) {
      local_120 = pMVar46->dims;
      local_11c = local_c8.dims;
      local_124 = local_118.dims;
      local_58 = local_c8.data;
      local_60 = local_118.data;
      iVar35 = this->output_transpose;
      local_68 = (long)(int)(uint)local_190;
      local_80 = 0;
      local_70 = &pMVar46->w;
      local_50 = &pMVar46->cstep;
      local_130 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(ulong)local_194;
      local_138 = 0;
      do {
        psVar31 = (size_t *)&local_c8.w;
        if (local_c8.dims == 3) {
          psVar31 = &local_c8.cstep;
        }
        if (0 < (int)(uint)local_190) {
          sVar2 = *psVar31;
          psVar31 = (size_t *)&local_118.w;
          if (local_118.dims == 3) {
            psVar31 = &local_118.cstep;
          }
          sVar29 = *psVar31;
          psVar31 = (size_t *)local_70;
          if (local_120 == 3) {
            psVar31 = local_50;
          }
          sVar30 = *psVar31;
          local_38 = local_138 * local_68;
          local_78 = pfVar47 + local_138;
          uVar33 = 0;
          pvVar32 = local_118.data;
          do {
            if (pfVar47 == (float *)0x0) {
              fVar51 = 0.0;
            }
            else {
              pfVar36 = pfVar47;
              switch(local_130) {
              case (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x0:
                break;
              case (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x1:
              case (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x2:
                pfVar36 = local_78;
                break;
              case (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x3:
                pfVar36 = pfVar47 + local_38 + uVar33;
                break;
              case (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x4:
                pfVar36 = pfVar47 + uVar33;
                break;
              default:
                fVar51 = 0.0;
                goto LAB_004a248b;
              }
              fVar51 = *pfVar36;
LAB_004a248b:
              fVar51 = fVar51 * this->beta;
            }
            if (0 < iVar40) {
              uVar37 = 0;
              do {
                fVar51 = fVar51 + *(float *)((long)pvVar32 + uVar37 * 4) *
                                  *(float *)((long)local_c8.data +
                                            uVar37 * 4 + (int)sVar2 * local_80);
                uVar37 = uVar37 + 1;
              } while (uVar45 != uVar37);
            }
            lVar41 = uVar33 * (long)(int)sVar30 * 4 + local_138 * 4;
            if (iVar35 == 0) {
              lVar41 = uVar33 * 4 + local_138 * (long)(int)sVar30 * 4;
            }
            *(float *)((long)local_48 + lVar41) = fVar51 * this->alpha;
            uVar33 = uVar33 + 1;
            pvVar32 = (void *)((long)pvVar32 + (long)(int)sVar29 * 4);
          } while (uVar33 != (local_190 & 0xffffffff));
        }
        local_138 = local_138 + 1;
        local_80 = local_80 + 4;
        local_40 = (ulong)uVar1;
      } while (local_138 != uVar1);
    }
    iVar35 = 0;
  }
  piVar3 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if (local_118.data != (void *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar35;
}

Assistant:

int Gemm::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A0 = constantA ? A_data : bottom_blobs[0];
    const Mat& B0 = constantB ? B_data : constantA ? bottom_blobs[0] : bottom_blobs[1];

    size_t elemsize = A0.elemsize;

    Mat A;
    if (transA == 0)
    {
        A = A0;
    }
    else
    {
        // transpose A to row-major
        A.create((A0.dims == 3 ? A0.c : A0.h), A0.w, elemsize, opt.workspace_allocator);

        const int A0_hstep = A0.dims == 3 ? (int)A0.cstep : A0.w;

        for (int i = 0; i < A.h; i++)
        {
            float* ptr = A.row(i);
            for (int j = 0; j < A.w; j++)
            {
                ptr[j] = A0[j * A0_hstep + i];
            }
        }
    }

    Mat B;
    if (transB == 0)
    {
        // transpose B to col-major
        B.create((B0.dims == 3 ? B0.c : B0.h), B0.w, elemsize, opt.workspace_allocator);

        const int B0_hstep = B0.dims == 3 ? (int)B0.cstep : B0.w;

        for (int i = 0; i < B.h; i++)
        {
            float* ptr = B.row(i);
            for (int j = 0; j < B.w; j++)
            {
                ptr[j] = B0[j * B0_hstep + i];
            }
        }
    }
    else
    {
        B = B0;
    }

    const int M = A.dims == 3 ? A.c : A.h;
    const int K = A.w; // assert A.w == B.w
    const int N = B.dims == 3 ? B.c : B.h;

    const float* ptrC = 0;
    int broadcast_type_C = 0;
    if (constantC)
    {
        ptrC = C_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            ptrC = bottom_blobs.size() == 1 ? bottom_blobs[0] : 0;
        }
        else if (constantA)
        {
            ptrC = bottom_blobs.size() == 2 ? bottom_blobs[1] : 0;
        }
        else if (constantB)
        {
            ptrC = bottom_blobs.size() == 2 ? bottom_blobs[1] : 0;
        }
        else
        {
            ptrC = bottom_blobs.size() == 3 ? bottom_blobs[2] : 0;
        }

        if (ptrC)
        {
            const Mat& C = bottom_blobs[bottom_blobs.size() - 1];

            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N, elemsize, opt.blob_allocator);
        else
            top_blob.create(M, N, elemsize, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M, elemsize, opt.blob_allocator);
        else
            top_blob.create(N, M, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < M; i++)
    {
        const int out_hstep = top_blob.dims == 3 ? (int)top_blob.cstep : top_blob.w;

        const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;
        const int B_hstep = B.dims == 3 ? (int)B.cstep : B.w;

        const float* ptrA = (const float*)A + i * A_hstep;

        for (int j = 0; j < N; j++)
        {
            const float* ptrB = (const float*)B + j * B_hstep;

            float sum = 0.f;
            if (ptrC)
            {
                if (broadcast_type_C == 0)
                {
                    sum = ptrC[0];
                }
                if (broadcast_type_C == 1)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 2)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 3)
                {
                    sum = ptrC[i * N + j];
                }
                if (broadcast_type_C == 4)
                {
                    sum = ptrC[j];
                }

                sum *= beta;
            }

            for (int k = 0; k < K; k++)
            {
                sum += ptrA[k] * ptrB[k];
            }

            sum *= alpha;

            if (output_transpose)
            {
                top_blob[j * out_hstep + i] = sum;
            }
            else
            {
                top_blob[i * out_hstep + j] = sum;
            }
        }
    }

    return 0;
}